

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Flow.c
# Opt level: O1

int Llb_ManFlowVerifyCut(Aig_Man_t *p,Vec_Ptr_t *vMinCut)

{
  void **ppvVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  
  Aig_ManIncrementTravId(p);
  iVar5 = vMinCut->nSize;
  if (0 < (long)iVar5) {
    ppvVar1 = vMinCut->pArray;
    iVar3 = p->nTravIds;
    lVar4 = 0;
    do {
      *(int *)((long)ppvVar1[lVar4] + 0x20) = iVar3;
      lVar4 = lVar4 + 1;
    } while (iVar5 != lVar4);
  }
  if (0 < p->nRegs) {
    iVar5 = 0;
    do {
      uVar2 = p->nTruePos + iVar5;
      if (((int)uVar2 < 0) || (p->vCos->nSize <= (int)uVar2)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      iVar3 = Llb_ManFlowVerifyCut_rec
                        (p,(Aig_Obj_t *)
                           (*(ulong *)((long)p->vCos->pArray[uVar2] + 8) & 0xfffffffffffffffe));
      if (iVar3 == 0) {
        return 0;
      }
      iVar5 = iVar5 + 1;
    } while (iVar5 < p->nRegs);
  }
  return 1;
}

Assistant:

int Llb_ManFlowVerifyCut( Aig_Man_t * p, Vec_Ptr_t * vMinCut )
{
    Aig_Obj_t * pObj;
    int i;
    // mark the cut with the current traversal ID
    Aig_ManIncrementTravId(p);
    Vec_PtrForEachEntry( Aig_Obj_t *, vMinCut, pObj, i )
        Aig_ObjSetTravIdCurrent( p, pObj );
    // search from the latches for a path to the COs/CIs
    Saig_ManForEachLi( p, pObj, i )
    {
        if ( !Llb_ManFlowVerifyCut_rec( p, Aig_ObjFanin0(pObj) ) )
            return 0;
    }
    return 1;
}